

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

void __thiscall CLI::App::_process_help_flags(App *this,bool trigger_help,bool trigger_all_help)

{
  bool bVar1;
  Option *this_00;
  Option *this_01;
  size_t sVar2;
  reference ppAVar3;
  CallForAllHelp *this_02;
  CallForHelp *this_03;
  App *sub;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range2;
  Option *help_all_ptr;
  Option *help_ptr;
  bool trigger_all_help_local;
  bool trigger_help_local;
  App *this_local;
  
  this_00 = get_help_ptr(this);
  this_01 = get_help_all_ptr(this);
  help_ptr._7_1_ = trigger_help;
  if ((this_00 != (Option *)0x0) && (sVar2 = Option::count(this_00), sVar2 != 0)) {
    help_ptr._7_1_ = 1;
  }
  help_ptr._6_1_ = trigger_all_help;
  if ((this_01 != (Option *)0x0) && (sVar2 = Option::count(this_01), sVar2 != 0)) {
    help_ptr._6_1_ = 1;
  }
  bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty(&this->parsed_subcommands_);
  if (bVar1) {
    if ((help_ptr._6_1_ & 1) != 0) {
      this_02 = (CallForAllHelp *)__cxa_allocate_exception(0x38);
      CallForAllHelp::CallForAllHelp(this_02);
      __cxa_throw(this_02,&CallForAllHelp::typeinfo,CallForAllHelp::~CallForAllHelp);
    }
    if ((help_ptr._7_1_ & 1) != 0) {
      this_03 = (CallForHelp *)__cxa_allocate_exception(0x38);
      CallForHelp::CallForHelp(this_03);
      __cxa_throw(this_03,&CallForHelp::typeinfo,CallForHelp::~CallForHelp);
    }
  }
  else {
    __end2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin(&this->parsed_subcommands_)
    ;
    sub = (App *)std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end
                           (&this->parsed_subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                                       *)&sub), bVar1) {
      ppAVar3 = __gnu_cxx::
                __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                ::operator*(&__end2);
      _process_help_flags(*ppAVar3,(bool)(help_ptr._7_1_ & 1),(bool)(help_ptr._6_1_ & 1));
      __gnu_cxx::
      __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_help_flags(bool trigger_help, bool trigger_all_help) const {
    const Option *help_ptr = get_help_ptr();
    const Option *help_all_ptr = get_help_all_ptr();

    if(help_ptr != nullptr && help_ptr->count() > 0)
        trigger_help = true;
    if(help_all_ptr != nullptr && help_all_ptr->count() > 0)
        trigger_all_help = true;

    // If there were parsed subcommands, call those. First subcommand wins if there are multiple ones.
    if(!parsed_subcommands_.empty()) {
        for(const App *sub : parsed_subcommands_)
            sub->_process_help_flags(trigger_help, trigger_all_help);

        // Only the final subcommand should call for help. All help wins over help.
    } else if(trigger_all_help) {
        throw CallForAllHelp();
    } else if(trigger_help) {
        throw CallForHelp();
    }
}